

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

string * readToken_abi_cxx11_(string *__return_storage_ptr__,char **pStart,char *pEnd,char sep)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = *pStart;
  pcVar2 = pcVar1;
  pcVar3 = pcVar1;
  if (pEnd < pcVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    while ((pcVar2 != pEnd && (*pcVar2 != sep))) {
      *pStart = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
      pcVar3 = pcVar3 + 1;
    }
    *pStart = pcVar2 + 1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readToken (const char* &pStart, const char* pEnd, char sep = ',')
{
    // Safety check
    if (pStart > pEnd) return std::string();
    
    const char* pBegin = pStart;
    for (; pStart != pEnd && *pStart != sep; ++pStart);
    // eat separator
    ++pStart;
    return std::string(pBegin, size_t(pStart - pBegin -1));
}